

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satcheck.c
# Opt level: O1

parasail_result_t *
parasail_sg_de_stats_scan_sse41_128_sat
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  parasail_result_t *ppVar2;
  
  ppVar2 = parasail_sg_de_stats_scan_sse41_128_8(s1,s1Len,s2,s2Len,open,gap,matrix);
  iVar1 = parasail_result_is_saturated(ppVar2);
  if (iVar1 != 0) {
    parasail_result_free(ppVar2);
    ppVar2 = parasail_sg_de_stats_scan_sse41_128_16(s1,s1Len,s2,s2Len,open,gap,matrix);
  }
  iVar1 = parasail_result_is_saturated(ppVar2);
  if (iVar1 == 0) {
    return ppVar2;
  }
  parasail_result_free(ppVar2);
  ppVar2 = parasail_sg_de_stats_scan_sse41_128_32(s1,s1Len,s2,s2Len,open,gap,matrix);
  return ppVar2;
}

Assistant:

parasail_result_t* parasail_sg_de_stats_scan_sse41_128_sat(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        const parasail_matrix_t *matrix)
{
    parasail_result_t * result = NULL;

    result = parasail_sg_de_stats_scan_sse41_128_8(s1, s1Len, s2, s2Len, open, gap, matrix);
    if (parasail_result_is_saturated(result)) {
        parasail_result_free(result);
        result = parasail_sg_de_stats_scan_sse41_128_16(s1, s1Len, s2, s2Len, open, gap, matrix);
    }
    if (parasail_result_is_saturated(result)) {
        parasail_result_free(result);
        result = parasail_sg_de_stats_scan_sse41_128_32(s1, s1Len, s2, s2Len, open, gap, matrix);
    }

    return result;
}